

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O0

void plutovg_path_add_round_rect
               (plutovg_path_t *path,float x,float y,float w,float h,float rx,float ry)

{
  float x2;
  float y2;
  float fVar1;
  float fVar2;
  undefined4 local_40;
  undefined4 local_3c;
  float cpy;
  float cpx;
  float bottom;
  float right;
  float ry_local;
  float rx_local;
  float h_local;
  float w_local;
  float y_local;
  float x_local;
  plutovg_path_t *path_local;
  
  local_3c = rx;
  if (w * 0.5 <= rx) {
    local_3c = w * 0.5;
  }
  local_40 = ry;
  if (h * 0.5 <= ry) {
    local_40 = h * 0.5;
  }
  if ((((local_3c != 0.0) || (NAN(local_3c))) || (local_40 != 0.0)) || (NAN(local_40))) {
    x2 = x + w;
    y2 = y + h;
    fVar1 = local_3c * 0.5522848;
    fVar2 = local_40 * 0.5522848;
    plutovg_path_reserve(path,0x1c);
    plutovg_path_move_to(path,x,y + local_40);
    plutovg_path_cubic_to(path,x,(y + local_40) - fVar2,(x + local_3c) - fVar1,y,x + local_3c,y);
    plutovg_path_line_to(path,x2 - local_3c,y);
    plutovg_path_cubic_to(path,(x2 - local_3c) + fVar1,y,x2,(y + local_40) - fVar2,x2,y + local_40);
    plutovg_path_line_to(path,x2,y2 - local_40);
    plutovg_path_cubic_to
              (path,x2,(y2 - local_40) + fVar2,(x2 - local_3c) + fVar1,y2,x2 - local_3c,y2);
    plutovg_path_line_to(path,x + local_3c,y2);
    plutovg_path_cubic_to(path,(x + local_3c) - fVar1,y2,x,(y2 - local_40) + fVar2,x,y2 - local_40);
    plutovg_path_line_to(path,x,y + local_40);
    plutovg_path_close(path);
  }
  else {
    plutovg_path_add_rect(path,x,y,w,h);
  }
  return;
}

Assistant:

void plutovg_path_add_round_rect(plutovg_path_t* path, float x, float y, float w, float h, float rx, float ry)
{
    rx = plutovg_min(rx, w * 0.5f);
    ry = plutovg_min(ry, h * 0.5f);
    if(rx == 0.f && ry == 0.f) {
        plutovg_path_add_rect(path, x, y, w, h);
        return;
    }

    float right = x + w;
    float bottom = y + h;

    float cpx = rx * PLUTOVG_KAPPA;
    float cpy = ry * PLUTOVG_KAPPA;

    plutovg_path_reserve(path, 6 * 2 + 4 * 4);
    plutovg_path_move_to(path, x, y+ry);
    plutovg_path_cubic_to(path, x, y+ry-cpy, x+rx-cpx, y, x+rx, y);
    plutovg_path_line_to(path, right-rx, y);
    plutovg_path_cubic_to(path, right-rx+cpx, y, right, y+ry-cpy, right, y+ry);
    plutovg_path_line_to(path, right, bottom-ry);
    plutovg_path_cubic_to(path, right, bottom-ry+cpy, right-rx+cpx, bottom, right-rx, bottom);
    plutovg_path_line_to(path, x+rx, bottom);
    plutovg_path_cubic_to(path, x+rx-cpx, bottom, x, bottom-ry+cpy, x, bottom-ry);
    plutovg_path_line_to(path, x, y+ry);
    plutovg_path_close(path);
}